

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas.cpp
# Opt level: O2

void NULLCCanvas::CanvasClearRGB(float red,float green,float blue,Canvas *ptr)

{
  char *pcVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 in_register_00001204 [12];
  undefined1 auVar5 [16];
  undefined1 auVar7 [16];
  undefined4 in_XMM1_Db;
  undefined1 auVar6 [16];
  
  auVar7._4_12_ = in_register_00001204;
  auVar7._0_4_ = red;
  auVar6._0_8_ = auVar7._0_8_;
  if (ptr != (Canvas *)0x0) {
    auVar6._8_4_ = in_register_00001204._0_4_;
    auVar6._12_4_ = in_XMM1_Db;
    auVar5._8_8_ = auVar6._8_8_;
    auVar5._4_4_ = green;
    auVar5._0_4_ = red;
    auVar7 = divps(auVar5,_DAT_00323ed0);
    uVar2 = ptr->height * ptr->width;
    uVar4 = 0;
    uVar3 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar3 = uVar4;
    }
    for (; uVar3 * 0x10 != uVar4; uVar4 = uVar4 + 0x10) {
      pcVar1 = (ptr->data).ptr;
      *(long *)(pcVar1 + uVar4) = auVar7._0_8_;
      *(float *)(pcVar1 + uVar4 + 8) = blue / 255.0;
      pcVar1 = pcVar1 + uVar4 + 0xc;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = -0x80;
      pcVar1[3] = '?';
    }
    return;
  }
  nullcThrowError("ERROR: Canvas object is nullptr");
  return;
}

Assistant:

void CanvasClearRGB(float red, float green, float blue, Canvas* ptr)
	{
		if(!ptr)
		{
			nullcThrowError("ERROR: Canvas object is nullptr");
			return;
		}
		float fRed = red / 255.0f;
		float fGreen = green / 255.0f;
		float fBlue = blue / 255.0f;
		for(int i = 0; i < ptr->width * ptr->height; i++)
		{
			((float*)ptr->data.ptr)[i * 4 + 0] = fRed;
			((float*)ptr->data.ptr)[i * 4 + 1] = fGreen;
			((float*)ptr->data.ptr)[i * 4 + 2] = fBlue;
			((float*)ptr->data.ptr)[i * 4 + 3] = 1.0f;
		}
	}